

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  ulong uVar1;
  bool bVar2;
  stringstream *psVar3;
  reference ppTVar4;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar5;
  size_type sVar6;
  const_reference ppTVar7;
  char *pcVar8;
  FILE *pFVar9;
  undefined8 uVar10;
  long in_RDI;
  stringstream stream;
  FILE *fileout;
  string *output_format;
  TestInfo *test_info;
  size_t j;
  bool printed_test_case_name;
  TestCase *test_case;
  size_t i;
  int kMaxParamLength;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  JsonUnitTestResultPrinter *in_stack_fffffffffffffc90;
  string *this_00;
  XmlUnitTestResultPrinter *this_01;
  stringstream *ss;
  string local_2f8 [8];
  string *in_stack_fffffffffffffd10;
  string local_2d8 [72];
  string local_290 [72];
  stringstream local_248 [16];
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *in_stack_fffffffffffffdc8;
  ostream *in_stack_fffffffffffffdd0;
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *in_stack_fffffffffffffde8;
  ostream *in_stack_fffffffffffffdf0;
  undefined1 local_b9 [33];
  string local_98 [32];
  FILE *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  value_type local_38;
  ulong local_30;
  byte local_21;
  TestCase *local_20;
  stringstream *local_18;
  undefined4 local_c;
  
  local_c = 0xfa;
  local_18 = (stringstream *)0x0;
  while (ss = local_18,
        psVar3 = (stringstream *)
                 std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                           ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                            (in_RDI + 0xb8)), ss < psVar3) {
    ppTVar4 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                         (in_RDI + 0xb8),(size_type)local_18);
    local_20 = *ppTVar4;
    local_21 = 0;
    local_30 = 0;
    while( true ) {
      uVar1 = local_30;
      pvVar5 = TestCase::test_info_list(local_20);
      sVar6 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar5);
      if (sVar6 <= uVar1) break;
      pvVar5 = TestCase::test_info_list(local_20);
      ppTVar7 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar5,local_30);
      local_38 = *ppTVar7;
      if ((local_38->matches_filter_ & 1U) != 0) {
        if ((local_21 & 1) == 0) {
          local_21 = 1;
          pcVar8 = TestCase::name((TestCase *)0x176fc9);
          printf("%s.",pcVar8);
          pcVar8 = TestCase::type_param
                             ((TestCase *)
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          if (pcVar8 != (char *)0x0) {
            printf("  # %s = ","TypeParam");
            TestCase::type_param
                      ((TestCase *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            PrintOnOneLine((char *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
          }
          printf("\n");
        }
        pcVar8 = TestInfo::name((TestInfo *)0x177037);
        printf("  %s",pcVar8);
        pcVar8 = TestInfo::value_param
                           ((TestInfo *)
                            CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        if (pcVar8 != (char *)0x0) {
          printf("  # %s = ","GetParam()");
          TestInfo::value_param
                    ((TestInfo *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          PrintOnOneLine((char *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
        }
        printf("\n");
      }
      local_30 = local_30 + 1;
    }
    local_18 = local_18 + 1;
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  local_40 = &local_60;
  bVar2 = std::operator==(&local_60,"xml");
  if ((bVar2) || (bVar2 = std::operator==(local_40,"json"), bVar2)) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    this_01 = (XmlUnitTestResultPrinter *)local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar8,(allocator *)this_01);
    pFVar9 = (FILE *)OpenFileForWriting(in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)local_b9);
    std::__cxx11::string::~string((string *)(local_b9 + 1));
    local_78 = pFVar9;
    std::__cxx11::stringstream::stringstream(local_248);
    bVar2 = std::operator==(local_40,"xml");
    if (bVar2) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      std::__cxx11::string::c_str();
      XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_01,pcVar8);
      XmlUnitTestResultPrinter::PrintXmlTestsList
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      XmlUnitTestResultPrinter::~XmlUnitTestResultPrinter
                ((XmlUnitTestResultPrinter *)in_stack_fffffffffffffc90);
      std::__cxx11::string::~string(local_290);
    }
    else {
      bVar2 = std::operator==(local_40,"json");
      if (bVar2) {
        UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
        std::__cxx11::string::c_str();
        JsonUnitTestResultPrinter::JsonUnitTestResultPrinter
                  ((JsonUnitTestResultPrinter *)this_01,pcVar8);
        JsonUnitTestResultPrinter::PrintJsonTestList
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        JsonUnitTestResultPrinter::~JsonUnitTestResultPrinter(in_stack_fffffffffffffc90);
        std::__cxx11::string::~string(local_2d8);
      }
    }
    pFVar9 = local_78;
    StringStreamToString(ss);
    this_00 = local_2f8;
    uVar10 = std::__cxx11::string::c_str();
    fprintf(pFVar9,"%s",uVar10);
    std::__cxx11::string::~string(this_00);
    fclose(local_78);
    std::__cxx11::stringstream::~stringstream(local_248);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (size_t i = 0; i < test_cases_.size(); i++) {
    const TestCase* const test_case = test_cases_[i];
    bool printed_test_case_name = false;

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      const TestInfo* const test_info =
          test_case->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_case_name) {
          printed_test_case_name = true;
          printf("%s.", test_case->name());
          if (test_case->type_param() != NULL) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_case->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != NULL) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml" || output_format == "json") {
    FILE* fileout = OpenFileForWriting(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str());
    std::stringstream stream;
    if (output_format == "xml") {
      XmlUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintXmlTestsList(&stream, test_cases_);
    } else if (output_format == "json") {
      JsonUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintJsonTestList(&stream, test_cases_);
    }
    fprintf(fileout, "%s", StringStreamToString(&stream).c_str());
    fclose(fileout);
  }
}